

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O3

int tmcomp(tm *atmp,tm *btmp)

{
  int iVar1;
  
  if (atmp->tm_year != btmp->tm_year) {
    return (uint)(btmp->tm_year <= atmp->tm_year) * 2 + -1;
  }
  iVar1 = atmp->tm_mon - btmp->tm_mon;
  if ((((iVar1 == 0) && (iVar1 = atmp->tm_mday - btmp->tm_mday, iVar1 == 0)) &&
      (iVar1 = atmp->tm_hour - btmp->tm_hour, iVar1 == 0)) &&
     (iVar1 = atmp->tm_min - btmp->tm_min, iVar1 == 0)) {
    return atmp->tm_sec - btmp->tm_sec;
  }
  return iVar1;
}

Assistant:

static int tmcomp( const struct tm * atmp, const struct tm * btmp )
{
    int result;

    if ( atmp->tm_year != btmp->tm_year )
    {
        return atmp->tm_year < btmp->tm_year ? -1 : 1;
    }

    if ( ( result = ( atmp->tm_mon - btmp->tm_mon ) ) == 0 &&
         ( result = ( atmp->tm_mday - btmp->tm_mday ) ) == 0 &&
         ( result = ( atmp->tm_hour - btmp->tm_hour ) ) == 0 &&
         ( result = ( atmp->tm_min - btmp->tm_min ) ) == 0 )
    {
        result = atmp->tm_sec - btmp->tm_sec;
    }

    return result;
}